

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagged_union.hpp
# Opt level: O0

void type_safe::detail::
     with_union<type_safe::detail::map_union<C_A_T_C_H_T_E_S_T_0()::functor_t&,type_safe::tagged_union<int,double,debugger_type>>::visitor&&,type_safe::tagged_union<int,double,debugger_type>&&,type_safe::union_types<int,double,debugger_type>,type_safe::tagged_union<int,double,debugger_type>&,C_A_T_C_H_T_E_S_T_0()::functor_t&,int&&>
     ::with_impl<double,debugger_type>
               (tagged_union<int,_double,_debugger_type> *param_1,
               tagged_union<int,_double,_debugger_type> *param_2,functor_t *param_3,int *param_4,
               int *param_5)

{
  bool bVar1;
  equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id> *lhs;
  union_type<double> local_39;
  int *local_38;
  int *args_local_2;
  functor_t *args_local_1;
  tagged_union<int,_double,_debugger_type> *args_local;
  visitor *func_local;
  tagged_union<int,_double,_debugger_type> *u_local;
  
  local_38 = param_5;
  args_local_2 = param_4;
  args_local_1 = param_3;
  args_local = param_2;
  func_local = (visitor *)param_1;
  lhs = (equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id> *)
        tagged_union<int,_double,_debugger_type>::type(param_1);
  union_type<double>::union_type(&local_39);
  bVar1 = strong_typedef_op::operator==(lhs,&local_39);
  if (bVar1) {
    with_union<type_safe::detail::map_union<functor_t_&,_type_safe::tagged_union<int,_double,_debugger_type>_>::visitor_&&,_type_safe::tagged_union<int,_double,_debugger_type>_&&,_type_safe::union_types<int,_double,_debugger_type>,_type_safe::tagged_union<int,_double,_debugger_type>_&,_functor_t_&,_int_&&>
    ::call<double>(0,(tagged_union<int,_double,_debugger_type> *)func_local,(visitor *)args_local,
                   (tagged_union<int,_double,_debugger_type> *)args_local_1,
                   (functor_t *)args_local_2,local_38);
  }
  else {
    with_union<type_safe::detail::map_union<functor_t_&,_type_safe::tagged_union<int,_double,_debugger_type>_>::visitor_&&,_type_safe::tagged_union<int,_double,_debugger_type>_&&,_type_safe::union_types<int,_double,_debugger_type>,_type_safe::tagged_union<int,_double,_debugger_type>_&,_functor_t_&,_int_&&>
    ::with_impl<debugger_type>(func_local,args_local,args_local_1,args_local_2,local_38);
  }
  return;
}

Assistant:

static void with_impl(union_types<Head, Tail...>, Union&& u, Func&& func, Args&&... args)
        {
            if (u.type() == union_type<Head>{})
                call<Head>(0, std::forward<Union>(u), std::forward<Func>(func),
                           std::forward<Args>(args)...);
            else
                with_impl(union_types<Tail...>{}, std::forward<Union>(u), std::forward<Func>(func),
                          std::forward<Args>(args)...);
        }